

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListWidgetItem::setSelected(QListWidgetItem *this,bool select)

{
  SelectionMode SVar1;
  QListModel *__s;
  QItemSelectionModel *pQVar2;
  int in_EDI;
  long in_FS_OFFSET;
  SelectionMode selectionMode;
  QListModel *model;
  QModelIndex index;
  SelectionFlag in_stack_ffffffffffffff9c;
  QListWidgetItem *in_stack_ffffffffffffffa0;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 local_20 [16];
  Data *local_10;
  QListWidgetItem **local_8;
  
  local_8 = *(QListWidgetItem ***)(in_FS_OFFSET + 0x28);
  __s = listModel(in_stack_ffffffffffffffa0);
  if (((__s != (QListModel *)0x0) &&
      (pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffffa0),
      pQVar2 != (QItemSelectionModel *)0x0)) &&
     (SVar1 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_ffffffffffffffa0),
     SVar1 != NoSelection)) {
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QListModel::index((QListModel *)local_20,(char *)__s,in_EDI);
    if (SVar1 == SingleSelection) {
      pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffffa0);
      QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c);
      (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,local_20,local_24);
    }
    else {
      pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffffa0);
      QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                ((QFlags<QItemSelectionModel::SelectionFlag> *)pQVar2,in_stack_ffffffffffffff9c);
      (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,local_20,local_28);
    }
  }
  if (*(QListWidgetItem ***)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetItem::setSelected(bool select)
{
    const QListModel *model = listModel();
    if (!model || !view->selectionModel())
        return;
    const QAbstractItemView::SelectionMode selectionMode = view->selectionMode();
    if (selectionMode == QAbstractItemView::NoSelection)
        return;
    const QModelIndex index = model->index(this);
    if (selectionMode == QAbstractItemView::SingleSelection)
        view->selectionModel()->select(index, select
                                       ? QItemSelectionModel::ClearAndSelect
                                       : QItemSelectionModel::Deselect);
    else
        view->selectionModel()->select(index, select
                                       ? QItemSelectionModel::Select
                                       : QItemSelectionModel::Deselect);
}